

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.h
# Opt level: O0

string * spdlog::details::os::thread_name_abi_cxx11_(void)

{
  long lVar1;
  ulong uVar2;
  string *in_RDI;
  long *in_FS_OFFSET;
  allocator local_49;
  string local_48 [32];
  char local_28 [8];
  char buffer [20];
  
  if ((char)in_FS_OFFSET[-3] == '\0') {
    lVar1 = *in_FS_OFFSET;
    std::__cxx11::string::string((string *)(lVar1 + -0x38));
    __cxa_thread_atexit(std::__cxx11::string::~string,(string *)(lVar1 + -0x38),&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -3) = 1;
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    _thread_name(local_28,0x14);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,local_28,&local_49);
    std::__cxx11::string::operator=((string *)(*in_FS_OFFSET + -0x38),local_48);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  std::__cxx11::string::string((string *)in_RDI,(string *)(*in_FS_OFFSET + -0x38));
  return in_RDI;
}

Assistant:

inline std::string thread_name()
{
    static const size_t    RECOMMENDED_BUFFER_SIZE = 20;
    char buffer[RECOMMENDED_BUFFER_SIZE];
    
#if defined(SPDLOG_DISABLE_TID_CACHING) || (defined(_MSC_VER) && (_MSC_VER < 1900)) || defined(__cplusplus_winrt) ||                       \
    (defined(__clang__) && !__has_feature(cxx_thread_local))
    _thread_name(buffer, sizeof(buffer));
    return std::string(buffer);
#else // cache thread name in thread local storage
    static thread_local std::string theThreadName; 
    if (theThreadName.empty())
    {
	_thread_name(buffer, sizeof(buffer));
	theThreadName = std::string(buffer);
    }
    return theThreadName;
#endif
}